

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_unknown_test.cc
# Opt level: O0

upb_UnknownCompareResult
CompareUnknownWithMaxDepth(UnknownFields *uf1,UnknownFields *uf2,int max_depth)

{
  upb_UnknownCompareResult uVar1;
  upb_Arena *puVar2;
  protobuf_test_messages_proto2_TestAllTypesProto2 *msg;
  protobuf_test_messages_proto2_TestAllTypesProto2 *msg_00;
  char *pcVar3;
  size_t sVar4;
  undefined1 local_a0 [8];
  string buf2;
  string buf1;
  protobuf_test_messages_proto2_TestAllTypesProto2 *msg2;
  protobuf_test_messages_proto2_TestAllTypesProto2 *msg1;
  undefined1 local_40 [8];
  Arena arena2;
  Arena arena1;
  int max_depth_local;
  UnknownFields *uf2_local;
  UnknownFields *uf1_local;
  
  upb::Arena::Arena((Arena *)&arena2.ptr_._M_t.
                              super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
                              super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
                              super__Head_base<0UL,_upb_Arena_*,_false>);
  upb::Arena::Arena((Arena *)local_40);
  puVar2 = upb::Arena::ptr((Arena *)&arena2.ptr_._M_t.
                                     super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
                                     super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
                                     super__Head_base<0UL,_upb_Arena_*,_false>);
  msg = protobuf_test_messages_proto2_TestAllTypesProto2_new(puVar2);
  puVar2 = upb::Arena::ptr((Arena *)local_40);
  msg_00 = protobuf_test_messages_proto2_TestAllTypesProto2_new(puVar2);
  ToBinaryPayload_abi_cxx11_((string *)((long)&buf2.field_2 + 8),uf1);
  ToBinaryPayload_abi_cxx11_((string *)local_a0,uf2);
  pcVar3 = (char *)std::__cxx11::string::data();
  sVar4 = std::__cxx11::string::size();
  puVar2 = upb::Arena::ptr((Arena *)&arena2.ptr_._M_t.
                                     super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
                                     super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
                                     super__Head_base<0UL,_upb_Arena_*,_false>);
  _upb_Message_AddUnknown_dont_copy_me__upb_internal_use_only
            (&msg->base_dont_copy_me__upb_internal_use_only,pcVar3,sVar4,puVar2,false);
  pcVar3 = (char *)std::__cxx11::string::data();
  sVar4 = std::__cxx11::string::size();
  puVar2 = upb::Arena::ptr((Arena *)local_40);
  _upb_Message_AddUnknown_dont_copy_me__upb_internal_use_only
            (&msg_00->base_dont_copy_me__upb_internal_use_only,pcVar3,sVar4,puVar2,false);
  uVar1 = _upb_Message_UnknownFieldsAreEqual_dont_copy_me__upb_internal_use_only
                    (&msg->base_dont_copy_me__upb_internal_use_only,
                     &msg_00->base_dont_copy_me__upb_internal_use_only,max_depth);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)(buf2.field_2._M_local_buf + 8));
  upb::Arena::~Arena((Arena *)local_40);
  upb::Arena::~Arena((Arena *)&arena2.ptr_._M_t.
                               super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
                               super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
                               super__Head_base<0UL,_upb_Arena_*,_false>);
  return uVar1;
}

Assistant:

upb_UnknownCompareResult CompareUnknownWithMaxDepth(UnknownFields uf1,
                                                    UnknownFields uf2,
                                                    int max_depth) {
  upb::Arena arena1;
  upb::Arena arena2;
  protobuf_test_messages_proto2_TestAllTypesProto2* msg1 =
      protobuf_test_messages_proto2_TestAllTypesProto2_new(arena1.ptr());
  protobuf_test_messages_proto2_TestAllTypesProto2* msg2 =
      protobuf_test_messages_proto2_TestAllTypesProto2_new(arena2.ptr());
  // Add the unknown fields to the messages.
  std::string buf1 = ToBinaryPayload(uf1);
  std::string buf2 = ToBinaryPayload(uf2);
  UPB_PRIVATE(_upb_Message_AddUnknown)(UPB_UPCAST(msg1), buf1.data(),
                                       buf1.size(), arena1.ptr(), false);
  UPB_PRIVATE(_upb_Message_AddUnknown)(UPB_UPCAST(msg2), buf2.data(),
                                       buf2.size(), arena2.ptr(), false);
  return UPB_PRIVATE(_upb_Message_UnknownFieldsAreEqual)(
      UPB_UPCAST(msg1), UPB_UPCAST(msg2), max_depth);
}